

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

int genBiomeNoiseScaled(BiomeNoise *bn,int *out,Range r,uint64_t sha)

{
  Range r_00;
  Range r_01;
  Range r_02;
  int iVar1;
  uint64_t uVar2;
  ulong uVar3;
  undefined8 in_RDX;
  uint64_t in_RSI;
  int in_EDI;
  int *unaff_retaddr;
  int iStack0000000000000008;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  BiomeNoise *in_stack_00000028;
  int y4;
  int z4;
  int x4;
  int *p;
  int *src;
  Range s;
  int k;
  int j;
  int i;
  uint64_t siz;
  undefined8 *puVar4;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  undefined4 uVar5;
  undefined4 uStack_54;
  long local_50;
  int iStack_44;
  int local_40;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar6;
  int iVar7;
  int iVar8;
  int y;
  int x;
  
  puVar4 = (undefined8 *)&stack0x00000008;
  y = (int)in_RDX;
  x = (int)((ulong)in_RDX >> 0x20);
  if (in_stack_00000020 == 0) {
    in_stack_00000020 = 1;
  }
  uVar3 = (long)in_stack_00000014 * (long)in_stack_00000020 * (long)in_stack_00000018;
  if (iStack0000000000000008 == 1) {
    r_00.z = in_stack_ffffffffffffff98;
    r_00._0_8_ = puVar4;
    r_00.sx = in_stack_ffffffffffffff9c;
    r_00.sz = in_stack_ffffffffffffffa0;
    r_00.y = in_stack_ffffffffffffffa4;
    r_00.sy = in_stack_ffffffffffffffa8;
    getVoronoiSrcRange(r_00);
    if (uVar3 < 2) {
      local_50 = 0;
    }
    else {
      local_50 = in_RSI + uVar3 * 4;
      r_01.z = y;
      r_01.scale = (int)uVar3;
      r_01.x = (int)(uVar3 >> 0x20);
      r_01.sx = x;
      r_01.sz = (int)in_RSI;
      r_01.y = (int)(in_RSI >> 0x20);
      r_01.sy = in_EDI;
      genBiomeNoise3D((BiomeNoise *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),r_01,
                      in_stack_ffffffffffffffc4);
    }
    uVar2 = in_RSI;
    for (iVar6 = 0; iVar6 < *(int *)(puVar4 + 3); iVar6 = iVar6 + 1) {
      for (iVar7 = 0; iVar7 < *(int *)(puVar4 + 2); iVar7 = iVar7 + 1) {
        iVar8 = 0;
        while( true ) {
          uStack_54 = (undefined4)(uVar2 >> 0x20);
          uVar5 = (undefined4)uVar2;
          if (*(int *)((long)puVar4 + 0xc) <= iVar8) break;
          voronoiAccess3D(in_RSI,x,y,(int)(uVar3 >> 0x20),(int *)CONCAT44(iVar8,iVar7),
                          (int *)CONCAT44(iVar6,in_stack_ffffffffffffffd0),unaff_retaddr);
          if (local_50 == 0) {
            iVar1 = sampleBiomeNoise(in_stack_00000028,
                                     (int64_t *)CONCAT44(in_stack_00000024,in_stack_00000020),
                                     in_stack_0000001c,in_stack_00000018,in_stack_00000014,
                                     _iStack0000000000000008,(uint32_t)p);
            *(int *)CONCAT44(uStack_54,uVar5) = iVar1;
          }
          else {
            in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 - iStack_44;
            in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c - in_stack_ffffffffffffffcc;
            in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 - local_40;
            *(undefined4 *)CONCAT44(uStack_54,uVar5) =
                 *(undefined4 *)
                  (local_50 +
                  ((long)in_stack_ffffffffffffff9c * (long)in_stack_ffffffffffffffc4 *
                   (long)in_stack_ffffffffffffffc8 +
                   (long)in_stack_ffffffffffffffa0 * (long)in_stack_ffffffffffffffc4 +
                  (long)in_stack_ffffffffffffffa4) * 4);
          }
          uVar2 = CONCAT44(uStack_54,uVar5) + 4;
          iVar8 = iVar8 + 1;
        }
      }
    }
  }
  else {
    r_02.z = y;
    r_02._0_8_ = uVar3;
    r_02.sx = x;
    r_02._16_8_ = in_RSI;
    r_02.sy = in_EDI;
    genBiomeNoise3D((BiomeNoise *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),r_02,
                    in_stack_ffffffffffffffc4);
  }
  return 0;
}

Assistant:

int genBiomeNoiseScaled(const BiomeNoise *bn, int *out, Range r, uint64_t sha)
{
    if (r.sy == 0)
        r.sy = 1;

    uint64_t siz = (uint64_t)r.sx*r.sy*r.sz;
    int i, j, k;

    if (r.scale == 1)
    {
        Range s = getVoronoiSrcRange(r);
        int *src;
        if (siz > 1)
        {   // the source range is large enough that we can try optimizing
            src = out + siz;
            genBiomeNoise3D(bn, src, s, 0);
        }
        else
        {
            src = NULL;
        }

        int *p = out;
        for (k = 0; k < r.sy; k++)
        {
            for (j = 0; j < r.sz; j++)
            {
                for (i = 0; i < r.sx; i++)
                {
                    int x4, z4, y4;
                    voronoiAccess3D(sha, r.x+i, r.y+k, r.z+j, &x4, &y4, &z4);
                    if (src)
                    {
                        x4 -= s.x; y4 -= s.y; z4 -= s.z;
                        *p = src[(int64_t)y4*s.sx*s.sz + (int64_t)z4*s.sx + x4];
                    }
                    else
                    {
                        *p = sampleBiomeNoise(bn, 0, x4, y4, z4, 0, 0);
                    }
                    p++;
                }
            }
        }
    }
    else
    {
        // There is (was?) an optimization that causes MC-241546, and should
        // not be enabled for accurate results. However, if the scale is higher
        // than 1:4, the accuracy becomes questionable anyway. Furthermore
        // situations that want to use a higher scale are usually better off
        // with a faster, if imperfect, result.
        genBiomeNoise3D(bn, out, r, r.scale > 4);
    }
    return 0;
}